

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3QuaternionTest.cpp
# Opt level: O2

void __thiscall SO3Zero::test_method(SO3Zero *this)

{
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_2db;
  RealScalar local_2d8;
  undefined1 local_2d0;
  undefined8 local_2c8;
  shared_count sStack_2c0;
  toQuat xQ;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  Matrix<double,_3,_3,_0,_3,_3> local_240;
  undefined **local_1f8;
  undefined1 local_1f0;
  undefined8 *local_1e8;
  char **local_1e0;
  SO3<mnf::ExpMapQuaternion> S;
  Point x;
  
  mnf::SO3<mnf::ExpMapQuaternion>::SO3(&S);
  mnf::Manifold::getZero();
  mnf::SubPoint::value();
  mnf::utils::ReverseQuaternion::ReverseQuaternion
            (&xQ,(double *)
                 local_240.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0]);
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x39);
  Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::toRotationMatrix
            ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)&xQ);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  local_2d8 = 1e-12;
  local_2d0 = Eigen::internal::
              isApprox_selector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_false>
              ::run(&local_240,&local_2db,&local_2d8);
  local_2c8 = 0;
  sStack_2c0.pi_ = (sp_counted_base *)0x0;
  local_1e0 = &local_270;
  local_270 = "xQ.matrix().isApprox(Eigen::Matrix3d::Identity())";
  local_268 = "";
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_00153be0;
  local_1e8 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2c0);
  mnf::utils::ReverseQuaternion::~ReverseQuaternion(&xQ);
  mnf::Point::~Point(&x);
  mnf::SO3<mnf::ExpMapQuaternion>::~SO3(&S);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SO3Zero)
{
  SO3<ExpMapQuaternion> S;
  Point x = S.getZero();
  toQuat xQ(x.value().data());

  BOOST_CHECK(xQ.matrix().isApprox(Eigen::Matrix3d::Identity()));
}